

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::EndChild(void)

{
  float fVar1;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  ImGuiNavHighlightFlags in_stack_00000018;
  ImGuiID in_stack_0000001c;
  ImRect *in_stack_00000020;
  ImRect bb;
  ImGuiWindow *parent_window;
  ImVec2 sz;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffff68;
  ImRect *in_stack_ffffffffffffff88;
  ImVec2 *min;
  ImGuiID id;
  ImVec2 in_stack_ffffffffffffff98;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImRect local_48;
  ImVec2 local_38;
  ImRect local_30;
  ImGuiWindow *local_20;
  ImVec2 local_18;
  ImGuiWindow *local_10;
  ImGuiContext *local_8;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  local_8 = GImGui;
  local_10 = GImGui->CurrentWindow;
  if ((GImGui->WithinEndChild & 1U) != 0) {
    __assert_fail("g.WithinEndChild == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1368,"void ImGui::EndChild()");
  }
  if ((local_10->Flags & 0x1000000U) == 0) {
    __assert_fail("window->Flags & ImGuiWindowFlags_ChildWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1369,"void ImGui::EndChild()");
  }
  GImGui->WithinEndChild = true;
  if (local_10->BeginCount < 2) {
    local_18 = local_10->Size;
    if ((local_10->AutoFitChildAxises & 1U) != 0) {
      fVar1 = ImMax<float>(4.0,local_18.x);
      local_18.x = fVar1;
    }
    if ((local_10->AutoFitChildAxises & 2U) != 0) {
      fVar1 = ImMax<float>(4.0,local_18.y);
      local_18.y = fVar1;
    }
    End();
    local_20 = local_8->CurrentWindow;
    min = &(local_20->DC).CursorPos;
    auVar2._0_8_ = ::operator+(in_stack_ffffffffffffff68,(ImVec2 *)0x1c2373);
    auVar2._8_56_ = extraout_var;
    local_38 = (ImVec2)vmovlpd_avx(auVar2._0_16_);
    ImRect::ImRect(&local_30,min,&local_38);
    ItemSize(min,(float)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    id = (ImGuiID)((ulong)min >> 0x20);
    if ((((local_10->DC).NavLayerActiveMask == 0) && (((local_10->DC).NavHasScroll & 1U) == 0)) ||
       ((local_10->Flags & 0x800000U) != 0)) {
      ItemAdd((ImRect *)in_stack_ffffffffffffff98,id,in_stack_ffffffffffffff88);
    }
    else {
      ItemAdd((ImRect *)in_stack_ffffffffffffff98,id,in_stack_ffffffffffffff88);
      RenderNavHighlight(in_stack_00000020,in_stack_0000001c,in_stack_00000018);
      if (((local_10->DC).NavLayerActiveMask == 0) && (local_10 == local_8->NavWindow)) {
        ImVec2::ImVec2(&local_58,2.0,2.0);
        auVar3._0_8_ = ::operator-(in_stack_ffffffffffffff68,(ImVec2 *)0x1c2476);
        auVar3._8_56_ = extraout_var_00;
        local_50 = (ImVec2)vmovlpd_avx(auVar3._0_16_);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff98,2.0,2.0);
        auVar4._0_8_ = ::operator+(in_stack_ffffffffffffff68,(ImVec2 *)0x1c24ae);
        auVar4._8_56_ = extraout_var_01;
        local_60 = (ImVec2)vmovlpd_avx(auVar4._0_16_);
        ImRect::ImRect(&local_48,&local_50,&local_60);
        RenderNavHighlight(in_stack_00000020,in_stack_0000001c,in_stack_00000018);
      }
    }
  }
  else {
    End();
  }
  local_8->WithinEndChild = false;
  local_8->LogLinePosY = -3.4028235e+38;
  return;
}

Assistant:

void ImGui::EndChild()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    IM_ASSERT(g.WithinEndChild == false);
    IM_ASSERT(window->Flags & ImGuiWindowFlags_ChildWindow);   // Mismatched BeginChild()/EndChild() calls

    g.WithinEndChild = true;
    if (window->BeginCount > 1)
    {
        End();
    }
    else
    {
        ImVec2 sz = window->Size;
        if (window->AutoFitChildAxises & (1 << ImGuiAxis_X)) // Arbitrary minimum zero-ish child size of 4.0f causes less trouble than a 0.0f
            sz.x = ImMax(4.0f, sz.x);
        if (window->AutoFitChildAxises & (1 << ImGuiAxis_Y))
            sz.y = ImMax(4.0f, sz.y);
        End();

        ImGuiWindow* parent_window = g.CurrentWindow;
        ImRect bb(parent_window->DC.CursorPos, parent_window->DC.CursorPos + sz);
        ItemSize(sz);
        if ((window->DC.NavLayerActiveMask != 0 || window->DC.NavHasScroll) && !(window->Flags & ImGuiWindowFlags_NavFlattened))
        {
            ItemAdd(bb, window->ChildId);
            RenderNavHighlight(bb, window->ChildId);

            // When browsing a window that has no activable items (scroll only) we keep a highlight on the child
            if (window->DC.NavLayerActiveMask == 0 && window == g.NavWindow)
                RenderNavHighlight(ImRect(bb.Min - ImVec2(2, 2), bb.Max + ImVec2(2, 2)), g.NavId, ImGuiNavHighlightFlags_TypeThin);
        }
        else
        {
            // Not navigable into
            ItemAdd(bb, 0);
        }
    }
    g.WithinEndChild = false;
    g.LogLinePosY = -FLT_MAX; // To enforce a carriage return
}